

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::shouldSendReset(Session *this)

{
  bool bVar1;
  SEQNUM SVar2;
  string beginString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             (string *)&(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string
            );
  bVar1 = std::operator>=(&local_30,"FIX.4.1");
  if ((bVar1) &&
     (((this->m_resetOnLogon != false || (this->m_resetOnLogout != false)) ||
      (this->m_resetOnDisconnect == true)))) {
    SVar2 = SessionState::getNextSenderMsgSeqNum(&this->m_state);
    if (SVar2 == 1) {
      SVar2 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
      bVar1 = SVar2 == 1;
      goto LAB_001b0e4b;
    }
  }
  bVar1 = false;
LAB_001b0e4b:
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool Session::shouldSendReset() {
  std::string beginString = m_sessionID.getBeginString();
  return beginString >= FIX::BeginString_FIX41 && (m_resetOnLogon || m_resetOnLogout || m_resetOnDisconnect)
         && (getExpectedSenderNum() == 1) && (getExpectedTargetNum() == 1);
}